

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall cfgfile::generator::cfg::model_t::model_t(model_t *this,model_t *other)

{
  string *psVar1;
  model_t *in_RSI;
  namespace_t *in_RDI;
  namespace_t *unaff_retaddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe8;
  namespace_t *other_00;
  
  other_00 = in_RDI;
  root_namespace(in_RSI);
  namespace_t::namespace_t(unaff_retaddr,other_00);
  global_includes_abi_cxx11_(in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RSI,in_stack_ffffffffffffffe8);
  relative_includes_abi_cxx11_(in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RSI,in_stack_ffffffffffffffe8);
  psVar1 = include_guard_abi_cxx11_(in_RSI);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].m_nested_namespaces.
              super__Vector_base<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar1);
  std::
  map<unsigned_long_long,_const_cfgfile::generator::cfg::class_t_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_const_cfgfile::generator::cfg::class_t_*>_>_>
  ::map((map<unsigned_long_long,_const_cfgfile::generator::cfg::class_t_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_const_cfgfile::generator::cfg::class_t_*>_>_>
         *)0x10a5b7);
  return;
}

Assistant:

model_t::model_t( const model_t & other )
	:	m_root( other.root_namespace() )
	,	m_global_includes( other.global_includes() )
	,	m_relative_includes( other.relative_includes() )
	,	m_include_guard( other.include_guard() )
{
}